

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureSpecificationTests.cpp
# Opt level: O2

void __thiscall
deqp::gles2::Functional::BasicTexImage2DCase::createTexture(BasicTexImage2DCase *this)

{
  ContextWrapper *this_00;
  uint uVar1;
  deUint32 type;
  uint uVar2;
  deUint32 dVar3;
  uint uVar4;
  int width;
  int height;
  int iVar5;
  int local_e4;
  deUint32 tex;
  int local_dc;
  ContextWrapper *local_d8;
  BasicTexImage2DCase *local_d0;
  TextureFormat fmt;
  Vec4 gMax;
  Random rnd;
  TextureLevel levelData;
  Vec4 gMin;
  PixelBufferAccess local_68;
  Vector<float,_4> local_40;
  
  fmt = (this->super_TextureSpecCase).m_texFormat;
  if (((this->super_TextureSpecCase).m_flags & 1) == 0) {
    local_e4 = 1;
  }
  else {
    uVar1 = (this->super_TextureSpecCase).m_width;
    uVar2 = 0x20;
    uVar4 = uVar2;
    if (uVar1 != 0) {
      uVar4 = 0x1f;
      if (uVar1 != 0) {
        for (; uVar1 >> uVar4 == 0; uVar4 = uVar4 - 1) {
        }
      }
      uVar4 = uVar4 ^ 0x1f;
    }
    uVar1 = (this->super_TextureSpecCase).m_height;
    if (uVar1 != 0) {
      uVar2 = 0x1f;
      if (uVar1 != 0) {
        for (; uVar1 >> uVar2 == 0; uVar2 = uVar2 - 1) {
        }
      }
      uVar2 = uVar2 ^ 0x1f;
    }
    local_e4 = 0x1f - uVar2;
    if ((int)(0x1f - uVar2) < (int)(0x1f - uVar4)) {
      local_e4 = 0x1f - uVar4;
    }
    local_e4 = local_e4 + 1;
  }
  tex = 0;
  tcu::TextureLevel::TextureLevel(&levelData,&fmt);
  dVar3 = deStringHash((this->super_TextureSpecCase).super_TestCase.super_TestCase.super_TestNode.
                       m_name._M_dataplus._M_p);
  deRandom_init(&rnd.m_rnd,dVar3);
  this_00 = &(this->super_TextureSpecCase).super_ContextWrapper;
  sglr::ContextWrapper::glGenTextures(this_00,1,&tex);
  sglr::ContextWrapper::glBindTexture(this_00,0xde1,tex);
  sglr::ContextWrapper::glPixelStorei(this_00,0xcf5,1);
  iVar5 = 0;
  local_d8 = this_00;
  local_d0 = this;
  while( true ) {
    if (local_e4 == iVar5) break;
    width = (this->super_TextureSpecCase).m_width >> ((byte)iVar5 & 0x1f);
    if (width < 2) {
      width = 1;
    }
    height = (this->super_TextureSpecCase).m_height >> ((byte)iVar5 & 0x1f);
    if (height < 2) {
      height = 1;
    }
    local_dc = iVar5;
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&local_68,0.0);
    tcu::Vector<float,_4>::Vector(&gMax,1.0);
    randomVector<4>((Functional *)&gMin,&rnd,(Vector<float,_4> *)&local_68,&gMax);
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&local_68,0.0);
    tcu::Vector<float,_4>::Vector(&local_40,1.0);
    randomVector<4>((Functional *)&gMax,&rnd,(Vector<float,_4> *)&local_68,&local_40);
    tcu::TextureLevel::setSize(&levelData,width,height,1);
    this = local_d0;
    iVar5 = local_dc;
    tcu::TextureLevel::getAccess(&local_68,&levelData);
    tcu::fillWithComponentGradients(&local_68,&gMin,&gMax);
    dVar3 = this->m_format;
    type = this->m_dataType;
    tcu::TextureLevel::getAccess(&local_68,&levelData);
    sglr::ContextWrapper::glTexImage2D
              (local_d8,0xde1,iVar5,dVar3,width,height,0,dVar3,type,
               local_68.super_ConstPixelBufferAccess.m_data);
    iVar5 = iVar5 + 1;
  }
  tcu::TextureLevel::~TextureLevel(&levelData);
  return;
}

Assistant:

void createTexture (void)
	{
		tcu::TextureFormat	fmt			= m_texFormat;
		int					numLevels	= (m_flags & MIPMAPS) ? de::max(deLog2Floor32(m_width), deLog2Floor32(m_height))+1 : 1;
		deUint32			tex			= 0;
		tcu::TextureLevel	levelData	(fmt);
		de::Random			rnd			(deStringHash(getName()));

		glGenTextures(1, &tex);
		glBindTexture(GL_TEXTURE_2D, tex);
		glPixelStorei(GL_UNPACK_ALIGNMENT, 1);

		for (int ndx = 0; ndx < numLevels; ndx++)
		{
			int		levelW		= de::max(1, m_width >> ndx);
			int		levelH		= de::max(1, m_height >> ndx);
			Vec4	gMin		= randomVector<4>(rnd);
			Vec4	gMax		= randomVector<4>(rnd);

			levelData.setSize(levelW, levelH);
			tcu::fillWithComponentGradients(levelData.getAccess(), gMin, gMax);

			glTexImage2D(GL_TEXTURE_2D, ndx, m_format, levelW, levelH, 0, m_format, m_dataType, levelData.getAccess().getDataPtr());
		}
	}